

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

int __thiscall
higan::TimerManager::GetTimeoutTimer
          (TimerManager *this,vector<higan::Timer,_std::allocator<higan::Timer>_> *timeout_timers)

{
  value_type *__x;
  bool bVar1;
  int64_t time;
  int iVar2;
  undefined1 local_90 [8];
  Timer new_timer;
  TimeStamp local_38;
  TimeStamp now;
  
  iVar2 = 0;
  if ((timeout_timers != (vector<higan::Timer,_std::allocator<higan::Timer>_> *)0x0) &&
     (iVar2 = 0,
     (this->timer_queue_).c.super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>._M_impl.
     super__Vector_impl_data._M_start !=
     (this->timer_queue_).c.super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>._M_impl.
     super__Vector_impl_data._M_finish)) {
    new_timer.timer_callback_._M_invoker = (_Invoker_type)timeout_timers;
    time = TimeStamp::Now();
    TimeStamp::TimeStamp(&local_38,time);
    (this->min_expire_time).microsecond_time_ =
         (((this->timer_queue_).c.super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>.
           _M_impl.super__Vector_impl_data._M_start)->expire_time_).microsecond_time_;
    bVar1 = TimeStamp::operator<(&local_38,&this->min_expire_time);
    iVar2 = 0;
    if (!bVar1) {
      iVar2 = 0;
      while ((this->timer_queue_).c.super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>.
             _M_impl.super__Vector_impl_data._M_start !=
             (this->timer_queue_).c.super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>.
             _M_impl.super__Vector_impl_data._M_finish) {
        bVar1 = TimeStamp::operator<=(&this->min_expire_time,&local_38);
        if (!bVar1) break;
        __x = (this->timer_queue_).c.super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>
              ._M_impl.super__Vector_impl_data._M_start;
        (this->min_expire_time).microsecond_time_ = (__x->expire_time_).microsecond_time_;
        std::vector<higan::Timer,_std::allocator<higan::Timer>_>::push_back
                  ((vector<higan::Timer,_std::allocator<higan::Timer>_> *)
                   new_timer.timer_callback_._M_invoker,__x);
        if (__x->repeat_ == true) {
          Timer::Timer((Timer *)local_90,__x);
          Timer::AdjustExpireTime((Timer *)local_90);
          Insert(this,(Timer *)local_90);
          Timer::~Timer((Timer *)local_90);
        }
        iVar2 = iVar2 + 1;
        std::
        priority_queue<higan::Timer,_std::vector<higan::Timer,_std::allocator<higan::Timer>_>,_std::less<higan::Timer>_>
        ::pop(&this->timer_queue_);
      }
    }
    TimeStamp::~TimeStamp(&local_38);
  }
  return iVar2;
}

Assistant:

int TimerManager::GetTimeoutTimer(std::vector<Timer>* timeout_timers)
{
	if (timer_queue_.empty() || timeout_timers == nullptr)
	{
		return 0;
	}

	TimeStamp now(TimeStamp::Now());
	min_expire_time = timer_queue_.top().GetExpireTime();

	if (now < min_expire_time)
	{
		return 0;
	}

	int result_count = 0;

	while (!timer_queue_.empty() && min_expire_time <= now)
	{
		result_count++;

		const Timer& timer = timer_queue_.top();
		min_expire_time = timer.GetExpireTime();

		timeout_timers->push_back(timer);

		if (timer.Repeat())
		{
			Timer new_timer(timer);
			new_timer.AdjustExpireTime();
			Insert(new_timer);
		}

		timer_queue_.pop();
	}

	return result_count;
}